

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig::ParseFromArray
          (JavaHprofConfig_ContinuousDumpConfig *this,void *raw,size_t size)

{
  byte bVar1;
  bool bVar2;
  short sVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong *puVar9;
  ulong *puVar10;
  uint8_t cur_byte_2;
  uint8_t cur_byte;
  ulong uVar11;
  uint8_t cur_byte_1;
  ulong *puVar12;
  Field local_48;
  ulong *local_38;
  
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar9 = (ulong *)(size + (long)raw);
  local_38 = (ulong *)raw;
  do {
    if (puVar9 <= local_38) goto switchD_00233b6b_caseD_3;
    bVar1 = (byte)*local_38;
    uVar8 = (ulong)bVar1;
    puVar10 = (ulong *)((long)local_38 + 1);
    if ((char)bVar1 < '\0') {
      uVar8 = (ulong)(bVar1 & 0x7f);
      lVar6 = 7;
      do {
        if ((puVar9 <= puVar10) || (0x38 < lVar6 - 7U)) goto switchD_00233b6b_caseD_3;
        uVar5 = *puVar10;
        puVar10 = (ulong *)((long)puVar10 + 1);
        uVar8 = uVar8 | (ulong)((byte)uVar5 & 0x7f) << ((byte)lVar6 & 0x3f);
        lVar6 = lVar6 + 7;
      } while ((char)(byte)uVar5 < '\0');
    }
    uVar5 = uVar8 >> 3;
    if (((uint)uVar5 == 0) || (puVar9 <= puVar10)) goto switchD_00233b6b_caseD_3;
    switch((uint)uVar8 & 7) {
    case 0:
      uVar7 = 0;
      uVar11 = 0;
      while( true ) {
        puVar12 = (ulong *)((long)puVar10 + 1);
        uVar7 = (ulong)((byte)*puVar10 & 0x7f) << ((byte)uVar11 & 0x3f) | uVar7;
        if (-1 < (char)(byte)*puVar10) break;
        if ((puVar9 <= puVar12) ||
           (bVar2 = 0x38 < uVar11, uVar11 = uVar11 + 7, puVar10 = puVar12, bVar2))
        goto switchD_00233b6b_caseD_3;
      }
      local_48.int_value_ = uVar7 & 0xffffffff00000000;
      break;
    case 1:
      puVar12 = puVar10 + 1;
      if (puVar9 < puVar12) goto switchD_00233b6b_caseD_3;
      uVar7 = *puVar10;
      local_48.int_value_ = uVar7 & 0xffffffff00000000;
      break;
    case 2:
      puVar10 = (ulong *)((long)puVar10 + 1);
      uVar11 = 0;
      uVar7 = 0;
      puVar12 = puVar10;
      while (uVar11 = (ulong)(*(byte *)((long)puVar12 + -1) & 0x7f) << ((byte)uVar7 & 0x3f) | uVar11
            , (char)*(byte *)((long)puVar12 + -1) < '\0') {
        if (puVar9 <= puVar12) goto switchD_00233b6b_caseD_3;
        puVar12 = (ulong *)((long)puVar12 + 1);
        puVar10 = (ulong *)((long)puVar10 + 1);
        bVar2 = 0x38 < uVar7;
        uVar7 = uVar7 + 7;
        if (bVar2) goto switchD_00233b6b_caseD_3;
      }
      if (uVar11 <= (ulong)((long)puVar9 - (long)puVar10)) {
        local_48.int_value_ = (ulong)puVar10 & 0xffffffff00000000;
        puVar12 = (ulong *)((long)puVar12 + uVar11);
        uVar7 = (ulong)puVar10 & 0xffffffff;
        goto LAB_00233c47;
      }
    default:
      goto switchD_00233b6b_caseD_3;
    case 5:
      puVar12 = (ulong *)((long)puVar10 + 4);
      if (puVar9 < puVar12) goto switchD_00233b6b_caseD_3;
      uVar7 = (ulong)(uint)*puVar10;
      local_48.int_value_ = 0;
    }
    uVar11 = 0;
LAB_00233c47:
    local_38 = puVar12;
  } while ((0xffff < (uint)uVar5) || (0xfffffff < uVar11));
  local_48.int_value_ = local_48.int_value_ | uVar7 & 0xffffffff;
  uVar7 = uVar5 << 0x20 | uVar11;
  local_48.type_ = (byte)(uVar7 >> 0x30) | (byte)uVar8 & 7;
  local_48.size_ = (uint32_t)uVar11;
  local_48.id_ = (uint16_t)(uVar7 >> 0x20);
  sVar3 = (short)uVar5;
  while (sVar3 != 0) {
    if ((ushort)uVar5 < 4) {
      (this->_has_field_).super__Base_bitset<1UL>._M_w =
           (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar5 & 0x3f);
    }
    if ((ushort)uVar5 == 3) {
      this->scan_pids_only_on_start_ = local_48.int_value_ != 0;
    }
    else {
      uVar4 = (uint)uVar5 & 0xffff;
      if (uVar4 == 2) {
        this->dump_interval_ms_ = (uint32_t)local_48.int_value_;
      }
      else if (uVar4 == 1) {
        this->dump_phase_ms_ = (uint32_t)local_48.int_value_;
      }
      else {
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>
                  (&local_48,&this->unknown_fields_);
      }
    }
    do {
      if (puVar9 <= local_38) goto switchD_00233b6b_caseD_3;
      bVar1 = (byte)*local_38;
      uVar8 = (ulong)(uint)bVar1;
      puVar10 = (ulong *)((long)local_38 + 1);
      if ((char)bVar1 < '\0') {
        uVar8 = (ulong)(bVar1 & 0x7f);
        lVar6 = 7;
        do {
          if ((puVar9 <= puVar10) || (0x38 < lVar6 - 7U)) goto switchD_00233b6b_caseD_3;
          uVar5 = *puVar10;
          puVar10 = (ulong *)((long)puVar10 + 1);
          uVar8 = uVar8 | (ulong)((byte)uVar5 & 0x7f) << ((byte)lVar6 & 0x3f);
          lVar6 = lVar6 + 7;
        } while ((char)(byte)uVar5 < '\0');
      }
      uVar5 = uVar8 >> 3;
      if (((uint)uVar5 == 0) || (puVar9 <= puVar10)) goto switchD_00233b6b_caseD_3;
      switch((uint)uVar8 & 7) {
      case 0:
        uVar7 = 0;
        uVar11 = 0;
        while( true ) {
          puVar12 = (ulong *)((long)puVar10 + 1);
          uVar7 = (ulong)((byte)*puVar10 & 0x7f) << ((byte)uVar11 & 0x3f) | uVar7;
          if (-1 < (char)(byte)*puVar10) break;
          if ((puVar9 <= puVar12) ||
             (bVar2 = 0x38 < uVar11, uVar11 = uVar11 + 7, puVar10 = puVar12, bVar2))
          goto switchD_00233b6b_caseD_3;
        }
        local_48.int_value_ = uVar7 & 0xffffffff00000000;
        break;
      case 1:
        puVar12 = puVar10 + 1;
        if (puVar9 < puVar12) goto switchD_00233b6b_caseD_3;
        uVar7 = *puVar10;
        local_48.int_value_ = uVar7 & 0xffffffff00000000;
        break;
      case 2:
        puVar10 = (ulong *)((long)puVar10 + 1);
        uVar11 = 0;
        uVar7 = 0;
        puVar12 = puVar10;
        while (uVar11 = (ulong)(*(byte *)((long)puVar12 + -1) & 0x7f) << ((byte)uVar7 & 0x3f) |
                        uVar11, (char)*(byte *)((long)puVar12 + -1) < '\0') {
          if (puVar9 <= puVar12) goto switchD_00233b6b_caseD_3;
          puVar12 = (ulong *)((long)puVar12 + 1);
          puVar10 = (ulong *)((long)puVar10 + 1);
          bVar2 = 0x38 < uVar7;
          uVar7 = uVar7 + 7;
          if (bVar2) goto switchD_00233b6b_caseD_3;
        }
        if (uVar11 <= (ulong)((long)puVar9 - (long)puVar10)) {
          local_48.int_value_ = (ulong)puVar10 & 0xffffffff00000000;
          puVar12 = (ulong *)((long)puVar12 + uVar11);
          uVar7 = (ulong)puVar10 & 0xffffffff;
          goto LAB_00233f1d;
        }
      default:
        goto switchD_00233b6b_caseD_3;
      case 5:
        puVar12 = (ulong *)((long)puVar10 + 4);
        if (puVar9 < puVar12) goto switchD_00233b6b_caseD_3;
        uVar7 = (ulong)(uint)*puVar10;
        local_48.int_value_ = 0;
      }
      uVar11 = 0;
LAB_00233f1d:
      local_38 = puVar12;
    } while ((0xffff < (uint)uVar5) || (0xfffffff < uVar11));
    local_48.int_value_ = local_48.int_value_ | uVar7 & 0xffffffff;
    uVar7 = uVar5 << 0x20 | uVar11;
    local_48.type_ = (byte)(uVar7 >> 0x30) | (byte)uVar8 & 7;
    local_48.size_ = (uint32_t)uVar11;
    local_48.id_ = (uint16_t)(uVar7 >> 0x20);
    sVar3 = (short)uVar5;
  }
switchD_00233b6b_caseD_3:
  return puVar9 == local_38;
}

Assistant:

bool JavaHprofConfig_ContinuousDumpConfig::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* dump_phase_ms */:
        field.get(&dump_phase_ms_);
        break;
      case 2 /* dump_interval_ms */:
        field.get(&dump_interval_ms_);
        break;
      case 3 /* scan_pids_only_on_start */:
        field.get(&scan_pids_only_on_start_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}